

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

void Fra_ClausSimInfoRecord(Clu_Man_t *p,int *pModel)

{
  uint uVar1;
  Cnf_Dat_t *pCVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  if (p->nCexes == p->nCexesAlloc) {
    Fra_ClausSimInfoRealloc(p);
  }
  if (p->nCexesAlloc <= p->nCexes) {
    __assert_fail("p->nCexes < p->nCexesAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0x409,"void Fra_ClausSimInfoRecord(Clu_Man_t *, int *)");
  }
  pCVar2 = p->pCnf;
  if (0 < pCVar2->nVars) {
    lVar4 = 0;
    do {
      if (pModel[lVar4] == 1) {
        if (p->vCexes->nSize <= lVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = p->vCexes->pArray[lVar4];
        lVar6 = (long)(p->nCexes >> 5);
        uVar1 = *(uint *)((long)pvVar3 + lVar6 * 4);
        uVar5 = p->nCexes & 0x1f;
        if ((uVar1 >> uVar5 & 1) != 0) {
          __assert_fail("Abc_InfoHasBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes ) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                        ,0x40e,"void Fra_ClausSimInfoRecord(Clu_Man_t *, int *)");
        }
        *(uint *)((long)pvVar3 + lVar6 * 4) = uVar1 | 1 << uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pCVar2->nVars);
  }
  p->nCexes = p->nCexes + 1;
  return;
}

Assistant:

void Fra_ClausSimInfoRecord( Clu_Man_t * p, int * pModel )
{
    int i;
    if ( p->nCexes == p->nCexesAlloc )
        Fra_ClausSimInfoRealloc( p );
    assert( p->nCexes < p->nCexesAlloc );
    for ( i = 0; i < p->pCnf->nVars; i++ )
    {
        if ( pModel[i] == l_True )
        {
            assert( Abc_InfoHasBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes ) == 0 );
            Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes );
        }
    }
    p->nCexes++;
}